

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,cmCustomCommandGenerator *ccg,cmGeneratorTarget *target,string *relative,
          bool echo_comment,ostream *content)

{
  cmMakefile *this_00;
  cmGlobalGenerator *pcVar1;
  undefined4 uVar2;
  bool bVar3;
  uint uVar4;
  TargetType targetType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text;
  string *psVar5;
  ulong uVar6;
  long lVar7;
  const_reference pvVar8;
  pointer this_01;
  long lVar9;
  char *pcVar10;
  cmCustomCommand *this_02;
  iterator iVar11;
  iterator iVar12;
  iterator iVar13;
  string_view sVar14;
  cmGlobalUnixMakefileGenerator3 *gg;
  string local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  string local_4c0;
  ulong local_4a0;
  size_type rcurly;
  size_type lcurly;
  string_view local_470;
  string local_460;
  undefined1 local_440 [8];
  string shellCommand;
  string local_410;
  string local_3f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  string output;
  RuleVariables vars;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_211;
  string local_210;
  undefined1 local_1f0 [8];
  string val;
  string launcher;
  undefined1 local_188 [7];
  bool has_slash;
  byte local_161;
  undefined1 local_160 [7];
  bool had_slash;
  string local_140;
  undefined1 local_120 [8];
  string suffix;
  undefined1 local_f8 [7];
  bool useCall;
  string cmd;
  undefined1 local_d0 [4];
  uint c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string workingDir;
  string dir;
  undefined1 local_60 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> comment
  ;
  bool echo_comment_local;
  string *relative_local;
  cmGeneratorTarget *target_local;
  cmCustomCommandGenerator *ccg_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  comment.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._39_1_ = echo_comment;
  if (echo_comment) {
    cmCustomCommandGenerator::GetComment_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_60,ccg);
    bVar3 = std::optional::operator_cast_to_bool((optional *)local_60);
    if (bVar3) {
      text = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_60);
      AppendEcho(this,commands,text,EchoGenerate,(EchoProgress *)0x0);
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_60);
  }
  psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)(workingDir.field_2._M_local_buf + 8),(string *)psVar5);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_((string *)&rulePlaceholderExpander,ccg);
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::__cxx11::string::operator=
              ((string *)(workingDir.field_2._M_local_buf + 8),(string *)&rulePlaceholderExpander);
  }
  if (content != (ostream *)0x0) {
    std::operator<<(content,(string *)(workingDir.field_2._M_local_buf + 8));
  }
  (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
    _vptr_cmOutputConverter[6])
            (&commands1.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d0);
  cmd.field_2._12_4_ = 0;
  do {
    uVar2 = cmd.field_2._12_4_;
    uVar4 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
    if (uVar4 <= (uint)uVar2) {
      CreateCDCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_d0,(string *)((long)&workingDir.field_2 + 8),relative);
      pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
      this_02 = cmCustomCommandGenerator::GetCC(ccg);
      bVar3 = cmCustomCommand::GetJobserverAware(this_02);
      if (bVar3) {
        uVar4 = (*pcVar1->_vptr_cmGlobalGenerator[0xf])();
        if ((uVar4 & 1) != 0) {
          iVar11 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_d0);
          iVar12 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_d0);
          iVar13 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_d0);
          std::
          transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmLocalUnixMakefileGenerator3::AppendCustomCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,cmCustomCommandGenerator_const&,cmGeneratorTarget*,std::__cxx11::string_const&,bool,std::ostream*)::__0>
                    (iVar11._M_current,iVar12._M_current,iVar13._M_current);
        }
      }
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (commands,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d0);
      std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
      ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                   *)&commands1.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&rulePlaceholderExpander);
      std::__cxx11::string::~string((string *)(workingDir.field_2._M_local_buf + 8));
      return;
    }
    cmCustomCommandGenerator::GetCommand_abi_cxx11_((string *)local_f8,ccg,cmd.field_2._12_4_);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      suffix.field_2._M_local_buf[0xf] = '\0';
      bVar3 = cmLocalGenerator::IsWindowsShell((cmLocalGenerator *)this);
      if (bVar3) {
        std::__cxx11::string::string((string *)local_120);
        uVar6 = std::__cxx11::string::size();
        if (4 < uVar6) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_160,(ulong)local_f8);
          cmsys::SystemTools::LowerCase(&local_140,(string *)local_160);
          std::__cxx11::string::operator=((string *)local_120,(string *)&local_140);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)local_160);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_120,".bat");
          if (!bVar3) {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_120,".cmd");
            if (!bVar3) goto LAB_009c1c33;
          }
          suffix.field_2._M_local_buf[0xf] = '\x01';
        }
LAB_009c1c33:
        std::__cxx11::string::~string((string *)local_120);
      }
      cmsys::SystemTools::ReplaceString((string *)local_f8,"/./","/");
      lVar7 = std::__cxx11::string::find((char)local_f8,0x2f);
      local_161 = lVar7 != -1;
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        cmOutputConverter::MaybeRelativeToCurBinDir
                  ((string *)local_188,(cmOutputConverter *)this,(string *)local_f8);
        std::__cxx11::string::operator=((string *)local_f8,(string *)local_188);
        std::__cxx11::string::~string((string *)local_188);
      }
      lVar7 = std::__cxx11::string::find((char)local_f8,0x2f);
      if (((local_161 & 1) != 0) && (lVar7 == -1)) {
        cmStrCat<char_const(&)[3],std::__cxx11::string&>
                  ((string *)((long)&launcher.field_2 + 8),(char (*) [3])0x103f0af,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
        std::__cxx11::string::operator=
                  ((string *)local_f8,(string *)(launcher.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::string((string *)(val.field_2._M_local_buf + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"RULE_LAUNCH_CUSTOM",&local_211);
      this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"CMAKE_BUILD_TYPE",&local_239);
      psVar5 = cmMakefile::GetSafeDefinition(this_00,&local_238);
      cmLocalGenerator::GetRuleLauncher
                ((string *)local_1f0,(cmLocalGenerator *)this,target,&local_210,psVar5);
      std::__cxx11::string::~string((string *)&local_238);
      std::allocator<char>::~allocator(&local_239);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator(&local_211);
      sVar14 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1f0);
      bVar3 = cmNonempty(sVar14);
      if (bVar3) {
        cmRulePlaceholderExpander::RuleVariables::RuleVariables
                  ((RuleVariables *)((long)&output.field_2 + 8));
        cmGeneratorTarget::GetName_abi_cxx11_(target);
        output.field_2._8_8_ = std::__cxx11::string::c_str();
        targetType = cmGeneratorTarget::GetType(target);
        cmState::GetTargetTypeName_abi_cxx11_(targetType);
        std::__cxx11::string::c_str();
        std::__cxx11::string::string((string *)&outputs);
        local_3d0 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
        bVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(local_3d0);
        if (!bVar3) {
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](local_3d0,0);
          std::__cxx11::string::operator=((string *)&outputs,(string *)pvVar8);
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) != 0) {
            cmOutputConverter::MaybeRelativeToCurBinDir
                      (&local_3f0,(cmOutputConverter *)this,(string *)&outputs);
            std::__cxx11::string::operator=((string *)&outputs,(string *)&local_3f0);
            std::__cxx11::string::~string((string *)&local_3f0);
          }
          sVar14 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)&outputs);
          shellCommand.field_2._8_8_ = sVar14._M_len;
          cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                    (&local_410,(cmOutputConverter *)this,sVar14,SHELL,false);
          std::__cxx11::string::operator=((string *)&outputs,(string *)&local_410);
          std::__cxx11::string::~string((string *)&local_410);
        }
        std::__cxx11::string::c_str();
        std::__cxx11::string::operator=
                  ((string *)(val.field_2._M_local_buf + 8),(string *)local_1f0);
        this_01 = std::
                  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                  ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                                *)&commands1.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (this_01,(cmOutputConverter *)this,(string *)((long)&val.field_2 + 8),
                   (RuleVariables *)((long)&output.field_2 + 8));
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)(val.field_2._M_local_buf + 8)," ");
        }
        std::__cxx11::string::~string((string *)&outputs);
      }
      MaybeConvertWatcomShellCommand((string *)local_440,this,(string *)local_f8);
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        sVar14 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_f8);
        local_470 = sVar14;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&local_460,(cmOutputConverter *)this,sVar14,SHELL,false);
        std::__cxx11::string::operator=((string *)local_440,(string *)&local_460);
        std::__cxx11::string::~string((string *)&local_460);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lcurly,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&val.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440)
      ;
      std::__cxx11::string::operator=((string *)local_f8,(string *)&lcurly);
      std::__cxx11::string::~string((string *)&lcurly);
      cmCustomCommandGenerator::AppendArguments(ccg,cmd.field_2._12_4_,(string *)local_f8);
      if (content != (ostream *)0x0) {
        lVar7 = std::__cxx11::string::c_str();
        lVar9 = std::__cxx11::string::size();
        std::operator<<(content,(char *)(lVar7 + lVar9));
      }
      if ((this->BorlandMakeCurlyHack & 1U) != 0) {
        uVar6 = std::__cxx11::string::find((char)local_f8,0x7b);
        rcurly = uVar6;
        if (uVar6 != 0xffffffffffffffff) {
          lVar7 = std::__cxx11::string::size();
          if (uVar6 < lVar7 - 1U) {
            local_4a0 = std::__cxx11::string::find((char)local_f8,0x7d);
            if ((local_4a0 == 0xffffffffffffffff) || (rcurly < local_4a0)) {
              std::__cxx11::string::substr((ulong)&local_4e0,(ulong)local_f8);
              std::__cxx11::string::substr((ulong)&local_500,(ulong)local_f8);
              cmStrCat<std::__cxx11::string,char_const(&)[4],std::__cxx11::string>
                        (&local_4c0,&local_4e0,(char (*) [4])"{{}",&local_500);
              std::__cxx11::string::operator=((string *)local_f8,(string *)&local_4c0);
              std::__cxx11::string::~string((string *)&local_4c0);
              std::__cxx11::string::~string((string *)&local_500);
              std::__cxx11::string::~string((string *)&local_4e0);
            }
          }
        }
      }
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) != 0) {
        if ((suffix.field_2._M_local_buf[0xf] & 1U) == 0) {
          bVar3 = cmLocalGenerator::IsNMake((cmLocalGenerator *)this);
          if (bVar3) {
            pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_f8);
            if (*pcVar10 == '\"') {
              cmStrCat<char_const(&)[14],std::__cxx11::string&>
                        ((string *)&gg,(char (*) [14])"echo >nul && ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8);
              std::__cxx11::string::operator=((string *)local_f8,(string *)&gg);
              std::__cxx11::string::~string((string *)&gg);
            }
          }
        }
        else {
          cmStrCat<char_const(&)[6],std::__cxx11::string&>
                    (&local_520,(char (*) [6])"call ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
          std::__cxx11::string::operator=((string *)local_f8,(string *)&local_520);
          std::__cxx11::string::~string((string *)&local_520);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_d0,(value_type *)local_f8);
      std::__cxx11::string::~string((string *)local_440);
      std::__cxx11::string::~string((string *)local_1f0);
      std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)local_f8);
    cmd.field_2._12_4_ = cmd.field_2._12_4_ + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomCommand(
  std::vector<std::string>& commands, cmCustomCommandGenerator const& ccg,
  cmGeneratorTarget* target, std::string const& relative, bool echo_comment,
  std::ostream* content)
{
  // Optionally create a command to display the custom command's
  // comment text.  This is used for pre-build, pre-link, and
  // post-build command comments.  Custom build step commands have
  // their comments generated elsewhere.
  if (echo_comment) {
    if (cm::optional<std::string> comment = ccg.GetComment()) {
      this->AppendEcho(commands, *comment,
                       cmLocalUnixMakefileGenerator3::EchoGenerate);
    }
  }

  // if the command specified a working directory use it.
  std::string dir = this->GetCurrentBinaryDirectory();
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }
  if (content) {
    *content << dir;
  }

  auto rulePlaceholderExpander = this->CreateRulePlaceholderExpander();

  // Add each command line to the set of commands.
  std::vector<std::string> commands1;
  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

      if (this->IsWindowsShell()) {
        std::string suffix;
        if (cmd.size() > 4) {
          suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
          if (suffix == ".bat" || suffix == ".cmd") {
            useCall = true;
          }
        }
      }

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd = this->MaybeRelativeToCurBinDir(cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = cmStrCat("./", cmd);
      }

      std::string launcher;
      // Short-circuit if there is no launcher.
      std::string val = this->GetRuleLauncher(
        target, "RULE_LAUNCH_CUSTOM",
        this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
      if (cmNonempty(val)) {
        // Expand rule variables referenced in the given launcher command.
        cmRulePlaceholderExpander::RuleVariables vars;
        vars.CMTargetName = target->GetName().c_str();
        vars.CMTargetType =
          cmState::GetTargetTypeName(target->GetType()).c_str();
        std::string output;
        const std::vector<std::string>& outputs = ccg.GetOutputs();
        if (!outputs.empty()) {
          output = outputs[0];
          if (workingDir.empty()) {
            output = this->MaybeRelativeToCurBinDir(output);
          }
          output =
            this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
        }
        vars.Output = output.c_str();

        launcher = val;
        rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
        if (!launcher.empty()) {
          launcher += " ";
        }
      }

      std::string shellCommand = this->MaybeConvertWatcomShellCommand(cmd);
      if (shellCommand.empty()) {
        shellCommand =
          this->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
      }
      cmd = launcher + shellCommand;

      ccg.AppendArguments(c, cmd);
      if (content) {
        // Rule content does not include the launcher.
        *content << (cmd.c_str() + launcher.size());
      }
      if (this->BorlandMakeCurlyHack) {
        // Borland Make has a very strange bug.  If the first curly
        // brace anywhere in the command string is a left curly, it
        // must be written {{} instead of just {.  Otherwise some
        // curly braces are removed.  The hack can be skipped if the
        // first curly brace is the last character.
        std::string::size_type lcurly = cmd.find('{');
        if (lcurly != std::string::npos && lcurly < (cmd.size() - 1)) {
          std::string::size_type rcurly = cmd.find('}');
          if (rcurly == std::string::npos || rcurly > lcurly) {
            // The first curly is a left curly.  Use the hack.
            cmd =
              cmStrCat(cmd.substr(0, lcurly), "{{}", cmd.substr(lcurly + 1));
          }
        }
      }
      if (launcher.empty()) {
        if (useCall) {
          cmd = cmStrCat("call ", cmd);
        } else if (this->IsNMake() && cmd[0] == '"') {
          cmd = cmStrCat("echo >nul && ", cmd);
        }
      }
      commands1.push_back(std::move(cmd));
    }
  }

  // Setup the proper working directory for the commands.
  this->CreateCDCommand(commands1, dir, relative);

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);

  // Prefix the commands with the jobserver prefix "+"
  if (ccg.GetCC().GetJobserverAware() && gg->IsGNUMakeJobServerAware()) {
    std::transform(commands1.begin(), commands1.end(), commands1.begin(),
                   [](std::string const& cmd) { return cmStrCat("+", cmd); });
  }

  // push back the custom commands
  cm::append(commands, commands1);
}